

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_endec.hxx
# Opt level: O0

back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __thiscall
cryptox::
evp_cipher_context<cryptox::symmetric_algorithm<&EVP_des_ede3_cfb64>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
::
update<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (evp_cipher_context<cryptox::symmetric_algorithm<&EVP_des_ede3_cfb64>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
           *this,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 first,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          last,back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               d_first)

{
  bool bVar1;
  int iVar2;
  reference puVar3;
  bool local_899;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_880;
  int local_874;
  ulong uStack_870;
  int o_sz;
  size_t i_sz;
  uint8_t output [1056];
  uint8_t input [1024];
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_40;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> oitr;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  itr;
  evp_cipher_context<cryptox::symmetric_algorithm<&EVP_des_ede3_cfb64>,_&EVP_DecryptInit_ex,_&EVP_DecryptUpdate,_&EVP_DecryptFinal_ex>
  *this_local;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> d_first_local;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last_local;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first_local;
  
  local_40.container = d_first.container;
  oitr.container = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)first._M_current;
  d_first_local.container = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)last._M_current
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&oitr,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 *)&d_first_local);
    if (!bVar1) {
      return (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
             local_40.container;
    }
    uStack_870 = 0;
    local_874 = 0;
    while( true ) {
      local_899 = false;
      if (uStack_870 < 0x400) {
        local_899 = __gnu_cxx::operator!=
                              ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&oitr,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                         *)&d_first_local);
      }
      if (local_899 == false) break;
      local_880 = __gnu_cxx::
                  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator++((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&oitr,0);
      puVar3 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*(&local_880);
      output[uStack_870 + 0x418] = *puVar3;
      uStack_870 = uStack_870 + 1;
    }
    iVar2 = EVP_DecryptUpdate(*(EVP_CIPHER_CTX **)this,(uchar *)&i_sz,&local_874,output + 0x418,
                              (int)uStack_870);
    if (iVar2 != 1) break;
    local_40 = std::
               copy<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                         ((uchar *)&i_sz,output + (long)local_874 + -8,local_40);
    *(ulong *)(this + 0x10) = uStack_870 + *(long *)(this + 0x10);
    *(long *)(this + 0x18) = (long)local_874 + *(long *)(this + 0x18);
  }
  return (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
         d_first.container;
}

Assistant:

Output update(Input first, Input last, Output d_first) {
			Input   itr = first;
			Output oitr = d_first;

			while (itr != last) {
				std::uint8_t input[1024];
				std::uint8_t output[1024 + EVP_MAX_BLOCK_LENGTH];

				size_t i_sz = 0;
				int    o_sz = 0;

				while (i_sz < sizeof(input) && itr != last)
					input[i_sz++] = *itr++;

				if (UpdateFx(_context, output, &o_sz, input, i_sz) != 1)
					return d_first;

				oitr = std::copy(output, output + o_sz, oitr);

				_total_input += i_sz;
				_total_output += o_sz;
			}

			return oitr;
		}